

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<4,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  int iVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong uVar21;
  undefined4 uVar22;
  ulong unaff_R15;
  vint4 bi_2;
  undefined1 auVar23 [64];
  undefined4 uVar24;
  vint4 bi_4;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  vint4 ai_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vfloat4 a0;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 ai_2;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai_7;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_4;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  vfloat<4> tNear;
  vint4 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  RayHit *local_1120;
  Intersectors *local_1118;
  RayQueryContext *local_1110;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1110 = context;
  local_1118 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar27 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar25 = vrsqrtss_avx(auVar27,auVar27);
    fVar35 = auVar25._0_4_;
    local_fb8[0] = fVar35 * 1.5 - auVar27._0_4_ * 0.5 * fVar35 * fVar35 * fVar35;
    local_1068 = aVar1.x;
    auVar40._0_4_ = local_1068 * local_fb8[0];
    auVar40._4_4_ = aVar1.y * local_fb8[0];
    auVar40._8_4_ = aVar1.z * local_fb8[0];
    auVar40._12_4_ = aVar1.field_3.w * local_fb8[0];
    auVar25 = vshufpd_avx(auVar40,auVar40,1);
    auVar27 = vmovshdup_avx(auVar40);
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar51._0_4_ = auVar27._0_4_ ^ 0x80000000;
    auVar44 = ZEXT816(0) << 0x40;
    auVar27 = vunpckhps_avx(auVar40,auVar44);
    auVar51._4_12_ = ZEXT812(0) << 0x20;
    auVar43 = vshufps_avx(auVar27,auVar51,0x41);
    auVar46._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
    auVar46._8_8_ = auVar55._8_8_ ^ auVar25._8_8_;
    auVar46 = vinsertps_avx(auVar46,auVar40,0x2a);
    auVar27 = vdpps_avx(auVar43,auVar43,0x7f);
    auVar25 = vdpps_avx(auVar46,auVar46,0x7f);
    auVar27 = vcmpps_avx(auVar25,auVar27,1);
    auVar56._0_4_ = auVar27._0_4_;
    auVar56._4_4_ = auVar56._0_4_;
    auVar56._8_4_ = auVar56._0_4_;
    auVar56._12_4_ = auVar56._0_4_;
    auVar27 = vblendvps_avx(auVar46,auVar43,auVar56);
    auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
    auVar46 = vrsqrtss_avx(auVar25,auVar25);
    fVar35 = auVar46._0_4_;
    fVar35 = fVar35 * 1.5 - auVar25._0_4_ * 0.5 * fVar35 * fVar35 * fVar35;
    auVar43._0_4_ = auVar27._0_4_ * fVar35;
    auVar43._4_4_ = auVar27._4_4_ * fVar35;
    auVar43._8_4_ = auVar27._8_4_ * fVar35;
    auVar43._12_4_ = auVar27._12_4_ * fVar35;
    auVar27 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar25 = vshufps_avx(auVar40,auVar40,0xc9);
    auVar52._0_4_ = auVar43._0_4_ * auVar25._0_4_;
    auVar52._4_4_ = auVar43._4_4_ * auVar25._4_4_;
    auVar52._8_4_ = auVar43._8_4_ * auVar25._8_4_;
    auVar52._12_4_ = auVar43._12_4_ * auVar25._12_4_;
    auVar27 = vfmsub231ps_fma(auVar52,auVar40,auVar27);
    auVar46 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar27 = vdpps_avx(auVar46,auVar46,0x7f);
    auVar25 = vrsqrtss_avx(auVar27,auVar27);
    fVar35 = auVar25._0_4_;
    fVar35 = fVar35 * 1.5 - fVar35 * auVar27._0_4_ * 0.5 * fVar35 * fVar35;
    auVar25._0_4_ = fVar35 * auVar46._0_4_;
    auVar25._4_4_ = fVar35 * auVar46._4_4_;
    auVar25._8_4_ = fVar35 * auVar46._8_4_;
    auVar25._12_4_ = fVar35 * auVar46._12_4_;
    auVar27._0_4_ = local_fb8[0] * auVar40._0_4_;
    auVar27._4_4_ = local_fb8[0] * auVar40._4_4_;
    auVar27._8_4_ = local_fb8[0] * auVar40._8_4_;
    auVar27._12_4_ = local_fb8[0] * auVar40._12_4_;
    auVar46 = vunpcklps_avx(auVar43,auVar27);
    auVar27 = vunpckhps_avx(auVar43,auVar27);
    auVar43 = vunpcklps_avx(auVar25,auVar44);
    auVar25 = vunpckhps_avx(auVar25,auVar44);
    local_f88 = vunpcklps_avx(auVar27,auVar25);
    local_fa8 = vunpcklps_avx(auVar46,auVar43);
    local_f98 = vunpckhps_avx(auVar46,auVar43);
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      auVar25 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      local_1038._8_4_ = 0x7fffffff;
      local_1038._0_8_ = 0x7fffffff7fffffff;
      local_1038._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar1,local_1038);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar44,1);
      auVar27 = vblendvps_avx((undefined1  [16])aVar1,auVar44,auVar27);
      auVar43 = vrcpps_avx(auVar27);
      auVar49._8_4_ = 0x3f800000;
      auVar49._0_8_ = &DAT_3f8000003f800000;
      auVar49._12_4_ = 0x3f800000;
      auVar27 = vfnmadd213ps_fma(auVar27,auVar43,auVar49);
      auVar51 = vfmadd132ps_fma(auVar27,auVar43,auVar43);
      local_1048 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      uStack_1044 = local_1048;
      uStack_1040 = local_1048;
      uStack_103c = local_1048;
      local_1058 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      uStack_1054 = local_1058;
      uStack_1050 = local_1058;
      uStack_104c = local_1058;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      local_1078 = vshufps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x55);
      _local_1088 = vshufps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0xaa);
      fVar35 = auVar51._0_4_;
      local_10a8._4_4_ = fVar35;
      local_10a8._0_4_ = fVar35;
      local_10a8._8_4_ = fVar35;
      local_10a8._12_4_ = fVar35;
      auVar54 = ZEXT1664(local_10a8);
      auVar27 = vmovshdup_avx(auVar51);
      auVar45._0_4_ = fVar35 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar45._4_4_ = auVar51._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar45._8_4_ = auVar51._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar45._12_4_ = auVar51._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      uVar18 = (ulong)(fVar35 < 0.0) * 0x10;
      auVar43 = vshufpd_avx(auVar51,auVar51,1);
      uVar20 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
      auVar27 = vshufps_avx(auVar45,auVar45,0x55);
      auVar40 = vshufps_avx(auVar45,auVar45,0xaa);
      uVar21 = CONCAT44(auVar45._0_4_,auVar45._0_4_);
      local_10b8._0_8_ = uVar21 ^ 0x8000000080000000;
      local_10b8._8_4_ = -auVar45._0_4_;
      local_10b8._12_4_ = -auVar45._0_4_;
      auVar57 = ZEXT1664(local_10b8);
      local_10c8._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      local_10c8._8_4_ = auVar27._8_4_ ^ 0x80000000;
      local_10c8._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar58 = ZEXT1664(local_10c8);
      local_10d8._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      local_10d8._8_4_ = auVar40._8_4_ ^ 0x80000000;
      local_10d8._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar59 = ZEXT1664(local_10d8);
      local_10e8 = vshufps_avx(auVar51,auVar51,0x55);
      auVar61 = ZEXT1664(local_10e8);
      local_10f8 = vshufps_avx(auVar51,auVar51,0xaa);
      auVar63 = ZEXT1664(local_10f8);
      uVar21 = (ulong)(auVar43._0_4_ < 0.0) << 4 | 0x40;
      uVar24 = auVar25._0_4_;
      local_1108._4_4_ = uVar24;
      local_1108._0_4_ = uVar24;
      local_1108._8_4_ = uVar24;
      local_1108._12_4_ = uVar24;
      auVar64 = ZEXT1664(local_1108);
      uVar24 = auVar46._0_4_;
      auVar23 = ZEXT1664(CONCAT412(uVar24,CONCAT48(uVar24,CONCAT44(uVar24,uVar24))));
      local_1098 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      uStack_1094 = local_1098;
      uStack_1090 = local_1098;
      uStack_108c = local_1098;
      local_1120 = ray;
      pauVar19 = (undefined1 (*) [16])local_f68;
      do {
        do {
          if (pauVar19 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar12 = pauVar19 + -1;
          pauVar19 = pauVar19 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar12 + 8));
        uVar15 = *(ulong *)*pauVar19;
        do {
          if ((uVar15 & 8) == 0) {
            fVar35 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar16 = (uint)uVar15 & 7;
            uVar14 = uVar15 & 0xfffffffffffffff0;
            uVar24 = (undefined4)(unaff_R15 >> 0x20);
            if (uVar16 == 3) {
              local_ff8 = *(undefined1 (*) [16])(uVar14 + 0x20);
              local_1018 = *(undefined1 (*) [16])(uVar14 + 0x50);
              local_1008 = *(undefined1 (*) [16])(uVar14 + 0x60);
              auVar49 = *(undefined1 (*) [16])(uVar14 + 0x70);
              local_1028 = *(undefined8 *)*(undefined1 (*) [16])(uVar14 + 0x70);
              uStack_1020 = *(undefined8 *)(uVar14 + 0x78);
              auVar27 = *(undefined1 (*) [16])(uVar14 + 0x80);
              auVar25 = *(undefined1 (*) [16])(uVar14 + 0x90);
              fStack_fbc = 1.0 - fVar35;
              auVar60._0_4_ = fVar35 * *(float *)(uVar14 + 0xe0);
              auVar60._4_4_ = fVar35 * *(float *)(uVar14 + 0xe4);
              auVar60._8_4_ = fVar35 * *(float *)(uVar14 + 0xe8);
              auVar60._12_4_ = fVar35 * *(float *)(uVar14 + 0xec);
              auVar62._0_4_ = fVar35 * *(float *)(uVar14 + 0xf0);
              auVar62._4_4_ = fVar35 * *(float *)(uVar14 + 0xf4);
              auVar62._8_4_ = fVar35 * *(float *)(uVar14 + 0xf8);
              auVar62._12_4_ = fVar35 * *(float *)(uVar14 + 0xfc);
              auVar36._0_4_ = fVar35 * *(float *)(uVar14 + 0x100);
              auVar36._4_4_ = fVar35 * *(float *)(uVar14 + 0x104);
              auVar36._8_4_ = fVar35 * *(float *)(uVar14 + 0x108);
              auVar36._12_4_ = fVar35 * *(float *)(uVar14 + 0x10c);
              auVar28._4_4_ = fStack_fbc;
              auVar28._0_4_ = fStack_fbc;
              auVar28._8_4_ = fStack_fbc;
              auVar28._12_4_ = fStack_fbc;
              auVar46 = ZEXT816(0) << 0x40;
              auVar44 = vfmadd231ps_fma(auVar60,auVar28,auVar46);
              auVar45 = vfmadd231ps_fma(auVar62,auVar28,auVar46);
              local_1138 = vfmadd231ps_fma(auVar36,auVar28,auVar46);
              local_fe8 = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x110);
              fStack_fe4 = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x114);
              fStack_fe0 = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x118);
              fStack_fdc = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x11c);
              local_fd8 = fVar35 * *(float *)(uVar14 + 0x120) + fStack_fbc;
              fStack_fd4 = fVar35 * *(float *)(uVar14 + 0x124) + fStack_fbc;
              fStack_fd0 = fVar35 * *(float *)(uVar14 + 0x128) + fStack_fbc;
              fStack_fcc = fVar35 * *(float *)(uVar14 + 300) + fStack_fbc;
              local_fc8 = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x130);
              fStack_fc4 = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x134);
              fStack_fc0 = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x138);
              fStack_fbc = fStack_fbc + fVar35 * *(float *)(uVar14 + 0x13c);
              auVar29._0_4_ = (float)local_1088._0_4_ * auVar27._0_4_;
              auVar29._4_4_ = (float)local_1088._4_4_ * auVar27._4_4_;
              auVar29._8_4_ = fStack_1080 * auVar27._8_4_;
              auVar29._12_4_ = fStack_107c * auVar27._12_4_;
              auVar32._0_4_ = (float)local_1088._0_4_ * auVar25._0_4_;
              auVar32._4_4_ = (float)local_1088._4_4_ * auVar25._4_4_;
              auVar32._8_4_ = fStack_1080 * auVar25._8_4_;
              auVar32._12_4_ = fStack_107c * auVar25._12_4_;
              auVar46 = vfmadd231ps_fma(auVar29,local_1078,local_1018);
              auVar43 = vfmadd231ps_fma(auVar32,local_1078,local_1008);
              auVar6._4_4_ = fStack_1064;
              auVar6._0_4_ = local_1068;
              auVar6._8_4_ = fStack_1060;
              auVar6._12_4_ = fStack_105c;
              auVar40 = vfmadd231ps_fma(auVar46,auVar6,local_ff8);
              auVar43 = vfmadd231ps_fma(auVar43,auVar6,*(undefined1 (*) [16])(uVar14 + 0x30));
              auVar46 = vandps_avx(local_1038,auVar40);
              auVar41._8_4_ = 0x219392ef;
              auVar41._0_8_ = 0x219392ef219392ef;
              auVar41._12_4_ = 0x219392ef;
              auVar46 = vcmpps_avx(auVar46,auVar41,1);
              auVar40 = vblendvps_avx(auVar40,auVar41,auVar46);
              auVar46 = vandps_avx(local_1038,auVar43);
              auVar46 = vcmpps_avx(auVar46,auVar41,1);
              auVar51 = vblendvps_avx(auVar43,auVar41,auVar46);
              auVar46 = *(undefined1 (*) [16])(uVar14 + 0xa0);
              auVar33._0_4_ = (float)local_1088._0_4_ * auVar46._0_4_;
              auVar33._4_4_ = (float)local_1088._4_4_ * auVar46._4_4_;
              auVar33._8_4_ = fStack_1080 * auVar46._8_4_;
              auVar33._12_4_ = fStack_107c * auVar46._12_4_;
              auVar43 = vfmadd231ps_fma(auVar33,local_1078,auVar49);
              auVar52 = vfmadd231ps_fma(auVar43,auVar6,*(undefined1 (*) [16])(uVar14 + 0x40));
              auVar43 = vandps_avx(local_1038,auVar52);
              auVar43 = vcmpps_avx(auVar43,auVar41,1);
              auVar43 = vblendvps_avx(auVar52,auVar41,auVar43);
              auVar52 = vrcpps_avx(auVar40);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = &DAT_3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar40 = vfnmadd213ps_fma(auVar40,auVar52,auVar37);
              auVar52 = vfmadd132ps_fma(auVar40,auVar52,auVar52);
              auVar40 = vrcpps_avx(auVar51);
              auVar51 = vfnmadd213ps_fma(auVar51,auVar40,auVar37);
              auVar55 = vfmadd132ps_fma(auVar51,auVar40,auVar40);
              auVar40 = vrcpps_avx(auVar43);
              auVar43 = vfnmadd213ps_fma(auVar43,auVar40,auVar37);
              auVar56 = vfmadd132ps_fma(auVar43,auVar40,auVar40);
              auVar64 = ZEXT1664(local_1108);
              auVar5._4_4_ = uStack_1094;
              auVar5._0_4_ = local_1098;
              auVar5._8_4_ = uStack_1090;
              auVar5._12_4_ = uStack_108c;
              auVar27 = vfmadd213ps_fma(auVar27,auVar5,*(undefined1 (*) [16])(uVar14 + 0xb0));
              auVar7._4_4_ = uStack_1054;
              auVar7._0_4_ = local_1058;
              auVar7._8_4_ = uStack_1050;
              auVar7._12_4_ = uStack_104c;
              auVar43 = vfmadd231ps_fma(auVar27,auVar7,local_1018);
              auVar27 = vfmadd213ps_fma(auVar25,auVar5,*(undefined1 (*) [16])(uVar14 + 0xc0));
              auVar25 = vfmadd213ps_fma(auVar46,auVar5,*(undefined1 (*) [16])(uVar14 + 0xd0));
              auVar27 = vfmadd231ps_fma(auVar27,auVar7,local_1008);
              auVar25 = vfmadd231ps_fma(auVar25,auVar7,auVar49);
              auVar8._4_4_ = uStack_1044;
              auVar8._0_4_ = local_1048;
              auVar8._8_4_ = uStack_1040;
              auVar8._12_4_ = uStack_103c;
              auVar46 = vfmadd231ps_fma(auVar43,auVar8,local_ff8);
              auVar43 = vfmadd231ps_fma(auVar27,auVar8,*(undefined1 (*) [16])(uVar14 + 0x30));
              auVar51 = vfmadd231ps_fma(auVar25,auVar8,*(undefined1 (*) [16])(uVar14 + 0x40));
              auVar27 = vsubps_avx(auVar44,auVar46);
              auVar59 = ZEXT1664(local_10d8);
              auVar9._4_4_ = fStack_fe4;
              auVar9._0_4_ = local_fe8;
              auVar9._8_4_ = fStack_fe0;
              auVar9._12_4_ = fStack_fdc;
              auVar25 = vsubps_avx(auVar9,auVar46);
              auVar46 = vsubps_avx(auVar45,auVar43);
              auVar61 = ZEXT1664(local_10e8);
              auVar10._4_4_ = fStack_fd4;
              auVar10._0_4_ = local_fd8;
              auVar10._8_4_ = fStack_fd0;
              auVar10._12_4_ = fStack_fcc;
              auVar43 = vsubps_avx(auVar10,auVar43);
              auVar58 = ZEXT1664(local_10c8);
              auVar40 = vsubps_avx(local_1138,auVar51);
              auVar63 = ZEXT1664(local_10f8);
              auVar11._4_4_ = fStack_fc4;
              auVar11._0_4_ = local_fc8;
              auVar11._8_4_ = fStack_fc0;
              auVar11._12_4_ = fStack_fbc;
              auVar51 = vsubps_avx(auVar11,auVar51);
              auVar47._0_4_ = auVar52._0_4_ * auVar27._0_4_;
              auVar47._4_4_ = auVar52._4_4_ * auVar27._4_4_;
              auVar47._8_4_ = auVar52._8_4_ * auVar27._8_4_;
              auVar47._12_4_ = auVar52._12_4_ * auVar27._12_4_;
              auVar38._0_4_ = auVar52._0_4_ * auVar25._0_4_;
              auVar38._4_4_ = auVar52._4_4_ * auVar25._4_4_;
              auVar38._8_4_ = auVar52._8_4_ * auVar25._8_4_;
              auVar38._12_4_ = auVar52._12_4_ * auVar25._12_4_;
              auVar50._0_4_ = auVar55._0_4_ * auVar46._0_4_;
              auVar50._4_4_ = auVar55._4_4_ * auVar46._4_4_;
              auVar50._8_4_ = auVar55._8_4_ * auVar46._8_4_;
              auVar50._12_4_ = auVar55._12_4_ * auVar46._12_4_;
              auVar53._0_4_ = auVar40._0_4_ * auVar56._0_4_;
              auVar53._4_4_ = auVar40._4_4_ * auVar56._4_4_;
              auVar53._8_4_ = auVar40._8_4_ * auVar56._8_4_;
              auVar53._12_4_ = auVar40._12_4_ * auVar56._12_4_;
              auVar42._0_4_ = auVar55._0_4_ * auVar43._0_4_;
              auVar42._4_4_ = auVar55._4_4_ * auVar43._4_4_;
              auVar42._8_4_ = auVar55._8_4_ * auVar43._8_4_;
              auVar42._12_4_ = auVar55._12_4_ * auVar43._12_4_;
              auVar30._0_4_ = auVar51._0_4_ * auVar56._0_4_;
              auVar30._4_4_ = auVar51._4_4_ * auVar56._4_4_;
              auVar30._8_4_ = auVar51._8_4_ * auVar56._8_4_;
              auVar30._12_4_ = auVar51._12_4_ * auVar56._12_4_;
              auVar27 = vpminsd_avx(auVar50,auVar42);
              auVar25 = vpminsd_avx(auVar53,auVar30);
              auVar27 = vmaxps_avx(auVar27,auVar25);
              auVar40 = vpminsd_avx(auVar47,auVar38);
              auVar43 = vpmaxsd_avx(auVar47,auVar38);
              auVar25 = vpmaxsd_avx(auVar50,auVar42);
              auVar46 = vpmaxsd_avx(auVar53,auVar30);
              auVar54 = ZEXT1664(local_10a8);
              auVar46 = vminps_avx(auVar25,auVar46);
              auVar25 = vmaxps_avx(local_1108,auVar40);
              auVar57 = ZEXT1664(local_10b8);
              local_1148 = vmaxps_avx(auVar25,auVar27);
              auVar27 = vminps_avx(auVar23._0_16_,auVar43);
              auVar27 = vminps_avx(auVar27,auVar46);
              auVar27 = vcmpps_avx(local_1148,auVar27,2);
              uVar22 = vmovmskps_avx(auVar27);
              unaff_R15 = CONCAT44(uVar24,uVar22);
            }
            else {
              auVar26._4_4_ = fVar35;
              auVar26._0_4_ = fVar35;
              auVar26._8_4_ = fVar35;
              auVar26._12_4_ = fVar35;
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar18),auVar26,
                                        *(undefined1 (*) [16])(uVar14 + 0x20 + uVar18));
              auVar27 = vfmadd213ps_fma(auVar27,auVar54._0_16_,auVar57._0_16_);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar20),auVar26,
                                        *(undefined1 (*) [16])(uVar14 + 0x20 + uVar20));
              auVar25 = vfmadd213ps_fma(auVar25,auVar61._0_16_,auVar58._0_16_);
              auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar21),auVar26,
                                        *(undefined1 (*) [16])(uVar14 + 0x20 + uVar21));
              auVar27 = vpmaxsd_avx(auVar27,auVar25);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar18 ^ 0x10)),
                                        auVar26,*(undefined1 (*) [16])
                                                 (uVar14 + 0x20 + (uVar18 ^ 0x10)));
              auVar43 = vfmadd213ps_fma(auVar46,auVar63._0_16_,auVar59._0_16_);
              auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar20 ^ 0x10)),
                                        auVar26,*(undefined1 (*) [16])
                                                 (uVar14 + 0x20 + (uVar20 ^ 0x10)));
              auVar25 = vfmadd213ps_fma(auVar25,auVar54._0_16_,auVar57._0_16_);
              auVar46 = vfmadd213ps_fma(auVar46,auVar61._0_16_,auVar58._0_16_);
              auVar46 = vpminsd_avx(auVar25,auVar46);
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar21 ^ 0x10)),
                                        auVar26,*(undefined1 (*) [16])
                                                 (uVar14 + 0x20 + (uVar21 ^ 0x10)));
              auVar40 = vfmadd213ps_fma(auVar25,auVar63._0_16_,auVar59._0_16_);
              auVar25 = vpmaxsd_avx(auVar43,auVar64._0_16_);
              local_1148 = vpmaxsd_avx(auVar27,auVar25);
              auVar27 = vpminsd_avx(auVar40,auVar23._0_16_);
              auVar27 = vpminsd_avx(auVar46,auVar27);
              if (uVar16 == 6) {
                auVar25 = vcmpps_avx(local_1148,auVar27,2);
                auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar26,2);
                auVar46 = vcmpps_avx(auVar26,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
                auVar27 = vandps_avx(auVar27,auVar46);
                auVar27 = vandps_avx(auVar27,auVar25);
              }
              else {
                auVar27 = vcmpps_avx(local_1148,auVar27,2);
              }
              auVar27 = vpslld_avx(auVar27,0x1f);
              uVar22 = vmovmskps_avx(auVar27);
              unaff_R15 = CONCAT44(uVar24,uVar22);
            }
          }
          if ((uVar15 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar13 = 4;
            }
            else {
              uVar14 = uVar15 & 0xfffffffffffffff0;
              lVar3 = 0;
              for (uVar15 = unaff_R15; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
              {
                lVar3 = lVar3 + 1;
              }
              iVar13 = 0;
              uVar17 = unaff_R15 - 1 & unaff_R15;
              uVar15 = *(ulong *)(uVar14 + lVar3 * 8);
              if (uVar17 != 0) {
                uVar16 = *(uint *)(local_1148 + lVar3 * 4);
                lVar3 = 0;
                for (uVar4 = uVar17; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
                  lVar3 = lVar3 + 1;
                }
                uVar17 = uVar17 - 1 & uVar17;
                uVar4 = *(ulong *)(uVar14 + lVar3 * 8);
                uVar2 = *(uint *)(local_1148 + lVar3 * 4);
                if (uVar17 == 0) {
                  if (uVar16 < uVar2) {
                    *(ulong *)*pauVar19 = uVar4;
                    *(uint *)(*pauVar19 + 8) = uVar2;
                    pauVar19 = pauVar19 + 1;
                  }
                  else {
                    *(ulong *)*pauVar19 = uVar15;
                    *(uint *)(*pauVar19 + 8) = uVar16;
                    uVar15 = uVar4;
                    pauVar19 = pauVar19 + 1;
                  }
                }
                else {
                  auVar31._8_8_ = 0;
                  auVar31._0_8_ = uVar15;
                  auVar27 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar16));
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = uVar4;
                  auVar25 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar2));
                  lVar3 = 0;
                  for (uVar15 = uVar17; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000
                      ) {
                    lVar3 = lVar3 + 1;
                  }
                  uVar17 = uVar17 - 1 & uVar17;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = *(ulong *)(uVar14 + lVar3 * 8);
                  auVar43 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_1148 + lVar3 * 4)));
                  auVar46 = vpcmpgtd_avx(auVar25,auVar27);
                  if (uVar17 == 0) {
                    auVar40 = vpshufd_avx(auVar46,0xaa);
                    auVar46 = vblendvps_avx(auVar25,auVar27,auVar40);
                    auVar27 = vblendvps_avx(auVar27,auVar25,auVar40);
                    auVar25 = vpcmpgtd_avx(auVar43,auVar46);
                    auVar40 = vpshufd_avx(auVar25,0xaa);
                    auVar25 = vblendvps_avx(auVar43,auVar46,auVar40);
                    auVar46 = vblendvps_avx(auVar46,auVar43,auVar40);
                    auVar43 = vpcmpgtd_avx(auVar46,auVar27);
                    auVar40 = vpshufd_avx(auVar43,0xaa);
                    auVar43 = vblendvps_avx(auVar46,auVar27,auVar40);
                    auVar27 = vblendvps_avx(auVar27,auVar46,auVar40);
                    *pauVar19 = auVar27;
                    pauVar19[1] = auVar43;
                    uVar15 = auVar25._0_8_;
                    pauVar19 = pauVar19 + 2;
                  }
                  else {
                    lVar3 = 0;
                    for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                      lVar3 = lVar3 + 1;
                    }
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = *(ulong *)(uVar14 + lVar3 * 8);
                    auVar51 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_1148 + lVar3 * 4)));
                    auVar40 = vpshufd_avx(auVar46,0xaa);
                    auVar46 = vblendvps_avx(auVar25,auVar27,auVar40);
                    auVar27 = vblendvps_avx(auVar27,auVar25,auVar40);
                    auVar25 = vpcmpgtd_avx(auVar51,auVar43);
                    auVar40 = vpshufd_avx(auVar25,0xaa);
                    auVar25 = vblendvps_avx(auVar51,auVar43,auVar40);
                    auVar43 = vblendvps_avx(auVar43,auVar51,auVar40);
                    auVar40 = vpcmpgtd_avx(auVar43,auVar27);
                    auVar51 = vpshufd_avx(auVar40,0xaa);
                    auVar40 = vblendvps_avx(auVar43,auVar27,auVar51);
                    auVar27 = vblendvps_avx(auVar27,auVar43,auVar51);
                    auVar43 = vpcmpgtd_avx(auVar25,auVar46);
                    auVar51 = vpshufd_avx(auVar43,0xaa);
                    auVar43 = vblendvps_avx(auVar25,auVar46,auVar51);
                    auVar25 = vblendvps_avx(auVar46,auVar25,auVar51);
                    auVar46 = vpcmpgtd_avx(auVar40,auVar25);
                    auVar51 = vpshufd_avx(auVar46,0xaa);
                    auVar46 = vblendvps_avx(auVar40,auVar25,auVar51);
                    auVar25 = vblendvps_avx(auVar25,auVar40,auVar51);
                    *pauVar19 = auVar27;
                    pauVar19[1] = auVar25;
                    pauVar19[2] = auVar46;
                    uVar15 = auVar43._0_8_;
                    pauVar19 = pauVar19 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar13 = 6;
          }
        } while (iVar13 == 0);
        if (iVar13 == 6) {
          local_1138._0_8_ = pauVar19;
          (**(code **)((long)local_1118->leafIntersector +
                      (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_1110);
          auVar64 = ZEXT1664(local_1108);
          auVar63 = ZEXT1664(local_10f8);
          auVar61 = ZEXT1664(local_10e8);
          auVar59 = ZEXT1664(local_10d8);
          auVar58 = ZEXT1664(local_10c8);
          auVar57 = ZEXT1664(local_10b8);
          auVar54 = ZEXT1664(local_10a8);
          fVar35 = (local_1120->super_RayK<1>).tfar;
          auVar23 = ZEXT1664(CONCAT412(fVar35,CONCAT48(fVar35,CONCAT44(fVar35,fVar35))));
          ray = local_1120;
          pauVar19 = (undefined1 (*) [16])local_1138._0_8_;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }